

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
 __thiscall
anon_unknown.dwarf_2e03a1b::InferPubkey
          (anon_unknown_dwarf_2e03a1b *this,CPubKey *pubkey,ParseScriptContext ctx,
          SigningProvider *provider)

{
  byte bVar1;
  _Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  _Var2;
  void *pvVar3;
  undefined8 uVar4;
  long lVar5;
  int iVar6;
  pointer __p;
  undefined8 *puVar7;
  undefined8 *puVar8;
  long in_FS_OFFSET;
  undefined4 local_60 [2];
  void *local_58;
  undefined8 uStack_50;
  long local_48;
  CKeyID local_40;
  _Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false> local_28;
  
  local_28._M_head_impl = *(PubkeyProvider **)(in_FS_OFFSET + 0x28);
  bVar1 = pubkey->vch[0];
  if (((bVar1 & 0xfe) == 2) ||
     ((((bVar1 < 8 && ((0xd0U >> (bVar1 & 0x1f) & 1) != 0)) && ((byte)(bVar1 - 2) < 3)) &&
      (ctx < P2WPKH)))) {
    puVar7 = (undefined8 *)operator_new(0x50);
    *(undefined4 *)(puVar7 + 1) = 0;
    *puVar7 = &PTR__PubkeyProvider_00b03900;
    memcpy((void *)((long)puVar7 + 0xc),pubkey,0x41);
    *(undefined1 *)((long)puVar7 + 0x4d) = 0;
    local_58 = (void *)0x0;
    uStack_50 = 0;
    local_48 = 0;
    CPubKey::GetID(&local_40,pubkey);
    iVar6 = (*provider->_vptr_SigningProvider[7])(provider,&local_40,local_60);
    if ((char)iVar6 == '\0') {
      *(undefined8 **)this = puVar7;
    }
    else {
      puVar8 = (undefined8 *)operator_new(0x40);
      lVar5 = local_48;
      uVar4 = uStack_50;
      pvVar3 = local_58;
      local_58 = (void *)0x0;
      uStack_50 = 0;
      local_48 = 0;
      *(undefined4 *)(puVar8 + 1) = 0;
      *puVar8 = &PTR__OriginPubkeyProvider_00b03a20;
      *(undefined4 *)(puVar8 + 2) = local_60[0];
      puVar8[3] = pvVar3;
      puVar8[4] = uVar4;
      puVar8[5] = lVar5;
      puVar8[6] = puVar7;
      *(undefined1 *)(puVar8 + 7) = 0;
      local_40.super_uint160.super_base_blob<160U>.m_data._M_elems[0] = '\0';
      local_40.super_uint160.super_base_blob<160U>.m_data._M_elems[1] = '\0';
      local_40.super_uint160.super_base_blob<160U>.m_data._M_elems[2] = '\0';
      local_40.super_uint160.super_base_blob<160U>.m_data._M_elems[3] = '\0';
      local_40.super_uint160.super_base_blob<160U>.m_data._M_elems[4] = '\0';
      local_40.super_uint160.super_base_blob<160U>.m_data._M_elems[5] = '\0';
      local_40.super_uint160.super_base_blob<160U>.m_data._M_elems[6] = '\0';
      local_40.super_uint160.super_base_blob<160U>.m_data._M_elems[7] = '\0';
      *(undefined8 **)this = puVar8;
      std::
      unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
      ::~unique_ptr((unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                     *)&local_40);
    }
    if (local_58 != (void *)0x0) {
      operator_delete(local_58,local_48 - (long)local_58);
    }
  }
  else {
    *(undefined8 *)this = 0;
  }
  _Var2.super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl =
       ((_Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
         *)(in_FS_OFFSET + 0x28))->
       super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>;
  if (_Var2.super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl ==
      (_Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>)local_28._M_head_impl) {
    return (__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
            )(tuple<(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
              )_Var2.super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>.
               _M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<PubkeyProvider> InferPubkey(const CPubKey& pubkey, ParseScriptContext ctx, const SigningProvider& provider)
{
    // Key cannot be hybrid
    if (!pubkey.IsValidNonHybrid()) {
        return nullptr;
    }
    // Uncompressed is only allowed in TOP and P2SH contexts
    if (ctx != ParseScriptContext::TOP && ctx != ParseScriptContext::P2SH && !pubkey.IsCompressed()) {
        return nullptr;
    }
    std::unique_ptr<PubkeyProvider> key_provider = std::make_unique<ConstPubkeyProvider>(0, pubkey, false);
    KeyOriginInfo info;
    if (provider.GetKeyOrigin(pubkey.GetID(), info)) {
        return std::make_unique<OriginPubkeyProvider>(0, std::move(info), std::move(key_provider), /*apostrophe=*/false);
    }
    return key_provider;
}